

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wal.cc
# Opt level: O0

fdb_status
wal_commit(fdb_txn *txn,filemgr *file,wal_commit_mark_func *func,err_log_callback *log_callback)

{
  ushort uVar1;
  byte bVar2;
  uint32_t uVar3;
  wal_item *pwVar4;
  err_log_callback *in_RCX;
  code *in_RDX;
  ulong length;
  ulong uVar5;
  undefined8 *in_RSI;
  undefined8 *in_RDI;
  uint64_t stale_offset;
  uint32_t stale_len;
  size_t seq_shard_num;
  uint64_t mem_overhead;
  size_t shard_num;
  fdb_status status;
  fdb_kvs_id_t kv_id;
  list_elem *e2;
  list_elem *e1;
  wal_item *_item;
  wal_item *item;
  int can_overwrite;
  char *in_stack_ffffffffffffff18;
  char *decrement;
  atomic<unsigned_long> *in_stack_ffffffffffffff20;
  _wal_update_type _Var6;
  list_elem *atomic_val;
  atomic<unsigned_long> *atomic_val_00;
  __atomic_base<unsigned_char> *in_stack_ffffffffffffff28;
  uint in_stack_ffffffffffffff30;
  int in_stack_ffffffffffffff34;
  uint in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff3c;
  wal_item *in_stack_ffffffffffffff40;
  avl_node *in_stack_ffffffffffffff48;
  err_log_callback *in_stack_ffffffffffffff50;
  bool local_a1;
  undefined4 in_stack_ffffffffffffff88;
  fdb_status fVar7;
  fdb_status fVar8;
  filemgr *in_stack_ffffffffffffff90;
  wal_item *local_68;
  list_elem *local_60;
  wal_item *local_50;
  
  fVar7 = FDB_RESULT_SUCCESS;
  local_60 = list_begin((list *)in_RDI[4]);
  do {
    if (local_60 == (list_elem *)0x0) {
      atomic_sub_uint64_t(in_stack_ffffffffffffff20,(int64_t)in_stack_ffffffffffffff18,
                          memory_order_relaxed);
      return fVar7;
    }
    local_50 = (wal_item *)&local_60[-7].next;
    if (local_60[-3].prev != (list_elem *)in_RDI[1]) {
      fdb_assert_die((char *)in_stack_ffffffffffffff40,
                     (char *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                     in_stack_ffffffffffffff34,(uint64_t)in_stack_ffffffffffffff28,
                     (uint64_t)in_stack_ffffffffffffff20);
    }
    uVar3 = get_checksum((uint8_t *)in_stack_ffffffffffffff20,(size_t)in_stack_ffffffffffffff18);
    length = (ulong)uVar3 % *(ulong *)(in_RSI[9] + 0x48);
    pthread_spin_lock((pthread_spinlock_t *)(*(long *)(in_RSI[9] + 0x38) + length * 0x18 + 0x10));
    bVar2 = std::__atomic_base::operator_cast_to_unsigned_char(in_stack_ffffffffffffff28);
    if ((bVar2 & 1) == 0) {
      bVar2 = std::__atomic_base::operator_cast_to_unsigned_char(in_stack_ffffffffffffff28);
      if ((bVar2 & 4) == 0) {
        in_stack_ffffffffffffff90 = (filemgr *)0x0;
      }
      else {
        buf2kvid(CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                 in_stack_ffffffffffffff28,(fdb_kvs_id_t *)in_stack_ffffffffffffff20);
      }
      std::__atomic_base<unsigned_char>::operator|=
                ((__atomic_base<unsigned_char> *)((long)&local_60[-2].prev + 1),'\x01');
      if (local_60[-4].next != (list_elem *)(in_RSI + 0x26)) {
        atomic_incr_uint32_t
                  ((atomic<unsigned_int> *)in_stack_ffffffffffffff20,
                   (memory_order)((ulong)in_stack_ffffffffffffff18 >> 0x20));
        _Var6 = (_wal_update_type)((ulong)in_stack_ffffffffffffff20 >> 0x20);
        if (*(char *)&local_60[-2].prev == '\0') {
          _wal_update_stat((filemgr *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                           (fdb_kvs_id_t)in_stack_ffffffffffffff28,_Var6);
        }
        else {
          _wal_update_stat((filemgr *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                           (fdb_kvs_id_t)in_stack_ffffffffffffff28,_Var6);
        }
      }
      if ((in_RDX != (code *)0x0) &&
         (fVar7 = (*in_RDX)(*in_RDI,local_60[-2].next), fVar7 != FDB_RESULT_SUCCESS)) {
        atomic_val = local_60[-2].next;
        decrement = "Error in appending a commit mark at offset %lu in a database file \'%s\'";
        fdb_log_impl(in_RCX,2,(fdb_status)(ulong)(uint)fVar7,
                     "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/wal.cc"
                     ,"wal_commit",0x511,
                     "Error in appending a commit mark at offset %lu in a database file \'%s\'",
                     atomic_val,*in_RSI);
        pthread_spin_unlock((pthread_spinlock_t *)
                            (*(long *)(in_RSI[9] + 0x38) + length * 0x18 + 0x10));
        atomic_sub_uint64_t((atomic<unsigned_long> *)atomic_val,(int64_t)decrement,
                            memory_order_relaxed);
        return fVar7;
      }
      list_remove((list *)&local_60[-4].prev[2].next,(list_elem *)local_50);
      list_push_back((list *)&local_60[-4].prev[2].next,(list_elem *)local_50);
      local_68 = (wal_item *)list_prev((list_elem *)local_50);
      while ((local_68 != (wal_item *)0x0 &&
             (bVar2 = std::__atomic_base::operator_cast_to_unsigned_char(in_stack_ffffffffffffff28),
             (bVar2 & 1) != 0))) {
        pwVar4 = (wal_item *)list_prev(&local_68->list_elem);
        local_a1 = true;
        atomic_val_00 = in_stack_ffffffffffffff20;
        fVar8 = fVar7;
        if (local_50->shandle != local_68->shandle) {
          local_a1 = _wal_can_discard((wal *)in_RSI[9],local_68,local_50);
          atomic_val_00 = in_stack_ffffffffffffff20;
          fVar8 = fVar7;
        }
        if (local_a1 == false) {
          local_50 = local_68;
          in_stack_ffffffffffffff20 = atomic_val_00;
          fVar7 = fVar8;
          local_68 = pwVar4;
        }
        else {
          bVar2 = std::__atomic_base::operator_cast_to_unsigned_char(in_stack_ffffffffffffff28);
          if ((bVar2 & 2) == 0) {
            list_remove(&local_50->header->items,&local_68->list_elem);
            if (*(char *)(in_RSI[0x22] + 0x11) == '\x01') {
              uVar5 = local_68->seqnum % *(ulong *)(in_RSI[9] + 0x48);
              pthread_spin_lock((pthread_spinlock_t *)
                                (*(long *)(in_RSI[9] + 0x40) + uVar5 * 0x18 + 0x10));
              avl_remove((avl_tree *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
              pthread_spin_unlock((pthread_spinlock_t *)
                                  (*(long *)(in_RSI[9] + 0x40) + uVar5 * 0x18 + 0x10));
            }
            if ((local_68->action == '\0') || (local_68->action == '\x01')) {
              filemgr_mark_stale(in_stack_ffffffffffffff90,CONCAT44(fVar8,in_stack_ffffffffffffff88)
                                 ,length);
            }
            atomic_decr_uint32_t
                      ((atomic<unsigned_int> *)atomic_val_00,
                       (memory_order)((ulong)in_stack_ffffffffffffff18 >> 0x20));
            atomic_decr_uint32_t
                      ((atomic<unsigned_int> *)atomic_val_00,
                       (memory_order)((ulong)in_stack_ffffffffffffff18 >> 0x20));
            if (local_50->action != '\x02') {
              atomic_sub_uint64_t(atomic_val_00,(int64_t)in_stack_ffffffffffffff18,
                                  memory_order_relaxed);
            }
            _Var6 = (_wal_update_type)((ulong)atomic_val_00 >> 0x20);
            if (local_68->action == '\0') {
              _wal_update_stat((filemgr *)
                               CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                               (fdb_kvs_id_t)in_stack_ffffffffffffff28,_Var6);
            }
            else {
              _wal_update_stat((filemgr *)
                               CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                               (fdb_kvs_id_t)in_stack_ffffffffffffff28,_Var6);
            }
            _wal_free_item(in_stack_ffffffffffffff40,
                           (wal *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
            in_stack_ffffffffffffff20 = atomic_val_00;
            fVar7 = fVar8;
            local_68 = pwVar4;
          }
          else {
            in_stack_ffffffffffffff20 = (atomic<unsigned_long> *)local_68->seqnum;
            uVar1 = local_50->header->keylen;
            in_stack_ffffffffffffff50 = in_RCX;
            fVar7 = fVar8;
            bVar2 = atomic_get_uint8_t((atomic<unsigned_char> *)atomic_val_00,
                                       (memory_order)((ulong)in_stack_ffffffffffffff18 >> 0x20));
            in_stack_ffffffffffffff40 = (wal_item *)*in_RSI;
            in_stack_ffffffffffffff18 =
                 "Wal commit called when wal_flush in progress.item seqnum %lu keylen %d flags %x action %d%s"
            ;
            in_stack_ffffffffffffff28 =
                 (__atomic_base<unsigned_char> *)
                 CONCAT44((int)((ulong)in_stack_ffffffffffffff28 >> 0x20),(uint)uVar1);
            in_stack_ffffffffffffff30 = (uint)bVar2;
            in_stack_ffffffffffffff38 = (uint)local_68->action;
            fdb_log_impl(in_stack_ffffffffffffff50,5,(fdb_status)(ulong)(uint)fVar8,
                         "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/wal.cc"
                         ,"wal_commit",0x557);
            local_68 = pwVar4;
          }
        }
      }
    }
    local_60 = list_remove((list *)in_RDI[4],local_60);
    pthread_spin_unlock((pthread_spinlock_t *)(*(long *)(in_RSI[9] + 0x38) + length * 0x18 + 0x10));
  } while( true );
}

Assistant:

fdb_status wal_commit(fdb_txn *txn, struct filemgr *file,
                      wal_commit_mark_func *func,
                      err_log_callback *log_callback)
{
    int can_overwrite;
    struct wal_item *item, *_item;
    struct list_elem *e1, *e2;
    fdb_kvs_id_t kv_id;
    fdb_status status = FDB_RESULT_SUCCESS;
    size_t shard_num;
    uint64_t mem_overhead = 0;

    e1 = list_begin(txn->items);
    while(e1) {
        item = _get_entry(e1, struct wal_item, list_elem_txn);
        fdb_assert(item->txn_id == txn->txn_id, item->txn_id, txn->txn_id);
        // Grab the WAL key shard lock.
        shard_num = get_checksum((uint8_t*)item->header->key,
                                 item->header->keylen) %
                                 file->wal->num_shards;
        spin_lock(&file->wal->key_shards[shard_num].lock);

        if (!(item->flag & WAL_ITEM_COMMITTED)) {
            // get KVS ID
            if (item->flag & WAL_ITEM_MULTI_KV_INS_MODE) {
                buf2kvid(item->header->chunksize, item->header->key, &kv_id);
            } else {
                kv_id = 0;
            }

            item->flag |= WAL_ITEM_COMMITTED;
            if (item->txn != &file->global_txn) {
                // increase num_flushable if it is transactional update
                atomic_incr_uint32_t(&file->wal->num_flushable);
                // Also since a transaction doc was committed
                // update global WAL stats to reflect this change..
                if (item->action == WAL_ACT_INSERT) {
                    _wal_update_stat(file, kv_id, _WAL_NEW_SET);
                } else {
                    _wal_update_stat(file, kv_id, _WAL_NEW_DEL);
                }
            }
            // append commit mark if necessary
            if (func) {
                status = func(txn->handle, item->offset);
                if (status != FDB_RESULT_SUCCESS) {
                    fdb_log(log_callback, FDB_LOG_ERROR, status,
                            "Error in appending a commit mark at offset %"
                            _F64 " in "
                            "a database file '%s'", item->offset,
                            file->filename);
                    spin_unlock(&file->wal->key_shards[shard_num].lock);
                    atomic_sub_uint64_t(&file->wal->mem_overhead, mem_overhead,
                                        std::memory_order_relaxed);
                    return status;
                }
            }
            // remove previously committed item if no snapshots refer to it,
            // move the committed item to the end of the wal_item_header's list
            list_remove(&item->header->items, &item->list_elem);
            list_push_back(&item->header->items, &item->list_elem);
            // now reverse scan among other committed items to de-duplicate..
            e2 = list_prev(&item->list_elem);
            while(e2) {
                _item = _get_entry(e2, struct wal_item, list_elem);
                if (!(_item->flag & WAL_ITEM_COMMITTED)) {
                    break;
                }
                e2 = list_prev(e2);
                can_overwrite = (item->shandle == _item->shandle ||
                                 _wal_can_discard(file->wal, _item, item));
                if (!can_overwrite) {
                    item = _item; // new covering item found
                    continue;
                }
                // committed but not flush-ready
                // (flush-readied item will be removed by flushing)
                if (!(_item->flag & WAL_ITEM_FLUSH_READY)) {
                    // remove from list & hash
                    list_remove(&item->header->items, &_item->list_elem);
                    if (file->config->seqtree_opt == FDB_SEQTREE_USE) {
                        size_t seq_shard_num = _item->seqnum
                                             % file->wal->num_shards;
                        spin_lock(&file->wal->seq_shards[seq_shard_num].lock);
                        avl_remove(&file->wal->seq_shards[seq_shard_num]._map,
                                   &_item->avl_seq);
                        spin_unlock(&file->wal->seq_shards[seq_shard_num].lock);
                    }

                    // mark previous doc region as stale
                    uint32_t stale_len = _item->doc_size;
                    uint64_t stale_offset = _item->offset;
                    if (_item->action == WAL_ACT_INSERT ||
                        _item->action == WAL_ACT_LOGICAL_REMOVE) {
                        // insert or logical remove
                        filemgr_mark_stale(file, stale_offset, stale_len);
                    }

                    atomic_decr_uint32_t(&file->wal->size);
                    atomic_decr_uint32_t(&file->wal->num_flushable);
                    if (item->action != WAL_ACT_REMOVE) {
                        atomic_sub_uint64_t(&file->wal->datasize,
                                            _item->doc_size,
                                            std::memory_order_relaxed);
                    }
                    // simply reduce the stat count...
                    if (_item->action == WAL_ACT_INSERT) {
                        _wal_update_stat(file, kv_id, _WAL_DROP_SET);
                    } else {
                        _wal_update_stat(file, kv_id, _WAL_DROP_DELETE);
                    }
                    mem_overhead += sizeof(struct wal_item);
                    _wal_free_item(_item, file->wal);
                } else {
                    fdb_log(log_callback, FDB_LOG_DEBUG, status,
                            "Wal commit called when wal_flush in progress."
                            "item seqnum %" _F64
                            " keylen %d flags %x action %d"
                            "%s", _item->seqnum, item->header->keylen,
                            atomic_get_uint8_t(&_item->flag),
                            _item->action, file->filename);
                }
            }
        }

        // remove from transaction's list
        e1 = list_remove(txn->items, e1);
        spin_unlock(&file->wal->key_shards[shard_num].lock);
    }
    atomic_sub_uint64_t(&file->wal->mem_overhead, mem_overhead,
                        std::memory_order_relaxed);

    return status;
}